

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::X<double>
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZFMatrix<double> *coord,TPZVec<double> *xi,
          TPZVec<double> *result)

{
  long lVar1;
  bool bVar2;
  MElementType MVar3;
  int iVar4;
  int x;
  long lVar5;
  TPZGeoMesh *pTVar6;
  int x_1;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  TPZVec<double> *pTVar11;
  int side_1;
  int subSide;
  double blendFactorSide;
  TPZGeoElSide gelside;
  TPZFNMatrix<9,_double> sidePhi;
  TPZManVector<double,_3> projectedPoint;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> nodeCoord;
  TPZManVector<double,_3> notUsedHereVec;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  TPZManVector<double,_3> neighXi_1;
  TPZManVector<double,_3> sideXi;
  TPZManVector<double,_3> neighXi;
  TPZGeoElSide neighbour;
  TPZFNMatrix<9,_double> phi;
  int local_aa4;
  double local_aa0;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *local_a98;
  _func_int **local_a90;
  double local_a88;
  int local_a7c;
  _func_int **local_a78;
  TPZGeoMesh *local_a70;
  TPZVec<double> *local_a68;
  double local_a60;
  pointer_____offset_0x18___ *local_a58;
  double local_a50;
  TPZVec<double> *local_a48;
  _func_int **local_a40;
  _func_int **local_a38;
  TPZGeoElSideIndex *local_a30;
  undefined **local_a28;
  undefined6 *local_a20;
  undefined8 local_a18;
  undefined8 local_a10;
  undefined6 uStack_a08;
  undefined2 uStack_a02;
  undefined6 uStack_a00;
  TPZGeoElSide local_9f0;
  TPZFMatrix<double> local_9d8;
  double local_948 [10];
  TPZManVector<double,_3> local_8f8;
  TPZManVector<double,_3> local_8c0;
  TPZManVector<double,_3> local_888;
  TPZManVector<double,_3> local_850;
  TPZManVector<int,_10> local_818;
  TPZManVector<int,_10> local_7d0;
  TPZManVector<double,_3> local_788;
  TPZManVector<double,_3> local_750;
  TPZVec<double> local_718;
  double adStack_6f8 [20];
  TPZFMatrix<double> local_658;
  double local_5c8 [28];
  TPZFMatrix<double> local_4e8;
  double local_458 [28];
  TPZFMatrix<double> local_378;
  double local_2e8 [28];
  TPZFMatrix<double> local_208;
  double local_178 [10];
  TPZGeoElSide local_128;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  local_a98 = this;
  if (this->fGeoEl == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1f6);
  }
  local_a70 = this->fGeoEl->fMesh;
  local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_850,3,(double *)&local_658);
  local_208.fElem = local_178;
  local_208.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x13;
  local_208.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x13;
  local_208.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_208.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_a38 = (_func_int **)&PTR__TPZFMatrix_01816238;
  local_208.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_208.fSize = 9;
  local_208.fGiven = local_208.fElem;
  TPZVec<int>::TPZVec(&local_208.fPivot.super_TPZVec<int>,0);
  local_208.fPivot.super_TPZVec<int>.fStore = local_208.fPivot.fExtAlloc;
  local_a78 = (_func_int **)&PTR__TPZManVector_01815498;
  local_208.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_208.fPivot.super_TPZVec<int>.fNElements = 0;
  local_208.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_a90 = (_func_int **)&PTR__TPZVec_01813df0;
  local_208.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_208.fWork.fStore = (double *)0x0;
  local_208.fWork.fNElements = 0;
  local_208.fWork.fNAlloc = 0;
  local_208.fElem = (double *)operator_new__(0xb48);
  local_a40 = (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_208.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZFMatrix<double>::operator=(&local_208,0.0);
  (*result->_vptr_TPZVec[3])(result,3);
  local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZVec<double>::Fill(result,(double *)&local_658,0,-1);
  if (local_a98->fNeighbours[0xd].fGeoElIndex == -1) {
    local_110.fElem = local_80;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 5;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_a38;
    local_110.fSize = 9;
    local_110.fGiven = local_110.fElem;
    TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
    local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
    local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = local_a78;
    local_110.fPivot.super_TPZVec<int>.fNElements = 0;
    local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_110.fWork._vptr_TPZVec = local_a90;
    local_110.fWork.fStore = (double *)0x0;
    local_110.fWork.fNElements = 0;
    local_110.fWork.fNAlloc = 0;
    local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         local_a40;
    local_a68 = xi;
    local_a48 = result;
    pztopology::TPZPyramid::TShape<double>(xi,&local_110,&local_208);
    pTVar11 = local_a68;
    local_a30 = local_a98->fNeighbours;
    lVar9 = 0;
    lVar7 = 0;
    do {
      lVar5 = 0;
      do {
        lVar8 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar8 <= lVar5) || ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar7)
           ) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_aa0 = *(double *)((long)coord->fElem + lVar5 * 8 + lVar8 * lVar9);
        if ((local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
           (local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_a48->fStore[lVar5] = local_aa0 * local_110.fElem[lVar7] + local_a48->fStore[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 8;
    } while (lVar7 != 5);
    local_a20 = &uStack_a08;
    local_a28 = &PTR__TPZManVector_0189a118;
    local_a18 = 0xe;
    local_a10 = 0;
    uStack_a08 = 0;
    uStack_a02 = 0;
    uStack_a00 = 0;
    lVar7 = -0xd;
    do {
      local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable._0_4_
           = (int)lVar7 + 0x12;
      bVar2 = pztopology::TPZPyramid::CheckProjectionForSingularity<double>
                        ((int *)&local_658,pTVar11);
      *(bool *)((long)local_a20 + lVar7 + 0xd) = bVar2;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
    TPZVec<double>::TPZVec(&local_718,0);
    local_718.fStore = adStack_6f8;
    local_718._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0189a1c0;
    local_718.fNElements = 0xe;
    local_718.fNAlloc = 0;
    adStack_6f8[0] = 0.0;
    adStack_6f8[1] = 0.0;
    adStack_6f8[2] = 0.0;
    adStack_6f8[3] = 0.0;
    adStack_6f8[4] = 0.0;
    adStack_6f8[5] = 0.0;
    adStack_6f8[6] = 0.0;
    adStack_6f8[7] = 0.0;
    adStack_6f8[8] = 0.0;
    adStack_6f8[9] = 0.0;
    adStack_6f8[10] = 0.0;
    adStack_6f8[0xb] = 0.0;
    adStack_6f8[0xc] = 0.0;
    adStack_6f8[0xd] = 0.0;
    local_658.fElem = local_5c8;
    local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xe;
    local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0189a510;
    local_658.fSize = 0x1b;
    local_658.fGiven = local_658.fElem;
    TPZVec<int>::TPZVec(&local_658.fPivot.super_TPZVec<int>,0);
    local_658.fPivot.super_TPZVec<int>.fStore = local_658.fPivot.fExtAlloc;
    local_658.fPivot.super_TPZVec<int>._vptr_TPZVec = local_a78;
    local_658.fPivot.super_TPZVec<int>.fNElements = 0;
    local_658.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_658.fWork._vptr_TPZVec = local_a90;
    local_658.fWork.fStore = (double *)0x0;
    local_658.fWork.fNElements = 0;
    local_658.fWork.fNAlloc = 0;
    local_658.fElem = (double *)operator_new__(0x150);
    local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0189a220;
    TPZFMatrix<double>::operator=(&local_658,0.0);
    local_378.fElem = local_2e8;
    local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xe;
    local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0189a510;
    local_378.fSize = 0x1b;
    local_378.fGiven = local_378.fElem;
    TPZVec<int>::TPZVec(&local_378.fPivot.super_TPZVec<int>,0);
    local_378.fPivot.super_TPZVec<int>.fStore = local_378.fPivot.fExtAlloc;
    local_378.fPivot.super_TPZVec<int>._vptr_TPZVec = local_a78;
    local_378.fPivot.super_TPZVec<int>.fNElements = 0;
    local_378.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_378.fWork._vptr_TPZVec = local_a90;
    local_378.fWork.fStore = (double *)0x0;
    local_378.fWork.fNElements = 0;
    local_378.fWork.fNAlloc = 0;
    local_378.fElem = (double *)operator_new__(0x150);
    local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0189a220;
    TPZFMatrix<double>::operator=(&local_378,0.0);
    local_4e8.fElem = local_458;
    local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0xe;
    local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
    local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0189a510;
    local_4e8.fSize = 0x1b;
    local_4e8.fGiven = local_4e8.fElem;
    TPZVec<int>::TPZVec(&local_4e8.fPivot.super_TPZVec<int>,0);
    local_4e8.fPivot.super_TPZVec<int>.fStore = local_4e8.fPivot.fExtAlloc;
    local_4e8.fPivot.super_TPZVec<int>._vptr_TPZVec = local_a78;
    local_4e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_4e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_4e8.fWork._vptr_TPZVec = local_a90;
    local_4e8.fWork.fStore = (double *)0x0;
    local_4e8.fWork.fNElements = 0;
    local_4e8.fWork.fNAlloc = 0;
    local_4e8.fElem = (double *)operator_new__(0x150);
    pTVar6 = local_a70;
    local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0189a220;
    TPZFMatrix<double>::operator=(&local_4e8,0.0);
    lVar7 = 0;
    local_a58 = &PTR_PTR_01816200;
    do {
      local_aa4 = (int)lVar7 + 5;
      if (*(char *)((long)local_a20 + lVar7) == '\x01') {
        TPZGeoElSide::TPZGeoElSide(&local_9f0,local_a30 + lVar7,pTVar6);
        bVar2 = IsLinearMapping(local_a98,local_aa4);
        if (((bVar2) || (local_9f0.fGeoEl == (TPZGeoEl *)0x0)) || (local_9f0.fSide < 0)) {
          local_718.fStore[lVar7] = 0.0;
        }
        else {
          TPZManVector<double,_3>::TPZManVector(&local_750,0);
          pztopology::TPZPyramid::MapToSide<double>
                    (local_aa4,local_a68,&local_750.super_TPZVec<double>,&local_208);
          MVar3 = pztopology::TPZPyramid::Type(local_aa4);
          switch(MVar3) {
          case EPoint:
            MVar3 = EOned;
            break;
          case EOned:
            MVar3 = ETriangle;
            break;
          case ETriangle:
            MVar3 = EQuadrilateral;
            break;
          case EQuadrilateral:
            MVar3 = ETetraedro;
            break;
          case ETetraedro:
          case EPiramide:
          case EPrisma:
            break;
          case ECube:
            MVar3 = EPolygonal;
            break;
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ElementType not found!",0x16);
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Common/pzeltype.h"
                       ,0x77);
          }
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               local_a38;
          local_9d8.fElem = local_948;
          local_9d8.fSize = 9;
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (long)(int)MVar3;
          local_9d8.fGiven = local_9d8.fElem;
          TPZVec<int>::TPZVec(&local_9d8.fPivot.super_TPZVec<int>,0);
          local_9d8.fPivot.super_TPZVec<int>._vptr_TPZVec = local_a78;
          local_9d8.fPivot.super_TPZVec<int>.fStore = local_9d8.fPivot.fExtAlloc;
          local_9d8.fPivot.super_TPZVec<int>.fNElements = 0;
          local_9d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_9d8.fWork._vptr_TPZVec = local_a90;
          local_9d8.fWork.fStore = (double *)0x0;
          local_9d8.fWork.fNElements = 0;
          local_9d8.fWork.fNAlloc = 0;
          local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               local_a40;
          TPZFMatrix<double>::Resize(&local_208,3,(long)(int)MVar3);
          GetSideShapeFunction<pzgeom::TPZGeoPyramid>
                    (local_aa4,&local_750.super_TPZVec<double>,&local_9d8,&local_208);
          TPZManVector<double,_3>::TPZManVector(&local_888,0);
          if ((int)MVar3 < 2) {
            MVar3 = EOned;
          }
          local_a50 = (double)(ulong)MVar3;
          dVar10 = 0.0;
          do {
            iVar4 = pztopology::TPZPyramid::SideNodeLocId(local_aa4,SUB84(dVar10,0));
            lVar9 = 0;
            do {
              lVar5 = (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if (((lVar5 <= lVar9) || (iVar4 < 0)) ||
                 ((coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)iVar4)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_aa0 = coord->fElem[lVar5 * iVar4 + lVar9];
              if ((local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)dVar10) ||
                 (local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_a88 = local_9d8.fElem[(long)dVar10];
              if ((local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                 (local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_378.fElem
              [local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar7] =
                   local_aa0 * local_a88 +
                   local_378.fElem
                   [local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar7];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            pztopology::TPZPyramid::ParametricDomainNodeCoord(iVar4,&local_888.super_TPZVec<double>)
            ;
            lVar9 = 0;
            do {
              local_aa0 = local_888.super_TPZVec<double>.fStore[lVar9];
              if ((local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)dVar10) ||
                 (local_9d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_a88 = local_9d8.fElem[(long)dVar10];
              if ((local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                 (local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_658.fElem
              [local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar7] =
                   local_aa0 * local_a88 +
                   local_658.fElem
                   [local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar7];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            dVar10 = (double)((long)dVar10 + 1);
          } while (dVar10 != local_a50);
          pztopology::TPZPyramid::BlendFactorForSide<double>
                    (&local_aa4,local_a68,local_718.fStore + lVar7,&local_850.super_TPZVec<double>);
          iVar4 = TPZGeoElSide::Dimension(&local_9f0);
          pTVar11 = local_a48;
          TPZManVector<double,_3>::TPZManVector(&local_788,0);
          bVar2 = MapToNeighSide<double>
                            (local_a98,local_aa4,iVar4,local_a68,&local_788.super_TPZVec<double>,
                             &local_208);
          pTVar6 = local_a70;
          if (bVar2) {
            local_7d0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)0x0;
            TPZManVector<double,_3>::TPZManVector(&local_8c0,3,(double *)&local_7d0);
            Neighbour(&local_128,local_a98,local_aa4,pTVar6);
            TPZGeoElSide::X(&local_128,&local_788.super_TPZVec<double>,
                            &local_8c0.super_TPZVec<double>);
            lVar9 = 0;
            do {
              local_aa0 = local_8c0.super_TPZVec<double>.fStore[lVar9];
              if ((local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                 (local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_4e8.fElem
              [local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar7] =
                   local_aa0;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_7d0);
            pztopology::TPZPyramid::LowerDimensionSides(local_aa4,(TPZStack<int,_10> *)&local_7d0,0)
            ;
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_818);
            pztopology::TPZPyramid::LowerDimensionSides(local_aa4,(TPZStack<int,_10> *)&local_818);
            for (lVar9 = (long)(int)local_7d0.super_TPZVec<int>.fNElements;
                lVar9 < local_818.super_TPZVec<int>.fNElements; lVar9 = lVar9 + 1) {
              local_a7c = local_818.super_TPZVec<int>.fStore[lVar9];
              if ((*(char *)((long)local_a20 + (long)local_a7c + -5) != '\0') &&
                 (bVar2 = IsLinearMapping(local_a98,local_a7c), !bVar2)) {
                local_a60 = -1.0;
                TPZManVector<double,_3>::TPZManVector(&local_8f8,3,&local_a60);
                lVar5 = 0;
                do {
                  if ((local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                     (local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_8f8.super_TPZVec<double>.fStore[lVar5] =
                       local_658.fElem
                       [local_658.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar7];
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 3);
                local_a60 = -1.0;
                pztopology::TPZPyramid::BlendFactorForSide<double>
                          (&local_a7c,&local_8f8.super_TPZVec<double>,&local_a60,
                           &local_850.super_TPZVec<double>);
                lVar5 = 0;
                do {
                  local_aa0 = local_a60;
                  lVar8 = (long)local_a7c;
                  if (((lVar8 < 5) ||
                      (lVar1 = lVar8 + -5,
                      local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar1)) ||
                     (local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_a88 = local_4e8.fElem
                              [local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 +
                               lVar8 + -5];
                  if ((local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar1) ||
                     (local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_a50 = local_378.fElem
                              [local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 +
                               lVar1];
                  if ((local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                     (local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar5)) {
                    TPZFMatrix<double>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  local_4e8.fElem
                  [local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar7] =
                       local_4e8.fElem
                       [local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar5 + lVar7]
                       - local_a60 * (local_a88 - local_a50);
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 3);
                TPZManVector<double,_3>::~TPZManVector(&local_8f8);
                pTVar11 = local_a48;
              }
            }
            lVar9 = 0;
            do {
              local_aa0 = local_718.fStore[lVar7];
              if ((local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                 (local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_a88 = local_4e8.fElem
                          [local_4e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 +
                           lVar7];
              if ((local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                 (local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar9)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pTVar11->fStore[lVar9] =
                   local_aa0 *
                   (local_a88 -
                   local_378.fElem
                   [local_378.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar9 + lVar7]) +
                   pTVar11->fStore[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            TPZManVector<int,_10>::~TPZManVector(&local_818);
            TPZManVector<int,_10>::~TPZManVector(&local_7d0);
            TPZManVector<double,_3>::~TPZManVector(&local_8c0);
          }
          pTVar6 = local_a70;
          TPZManVector<double,_3>::~TPZManVector(&local_788);
          TPZManVector<double,_3>::~TPZManVector(&local_888);
          TPZFMatrix<double>::~TPZFMatrix(&local_9d8,local_a58);
          TPZManVector<double,_3>::~TPZManVector(&local_750);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0xd);
    TPZFMatrix<double>::~TPZFMatrix(&local_4e8,&PTR_PTR_0189a4d8);
    TPZFMatrix<double>::~TPZFMatrix(&local_378,&PTR_PTR_0189a4d8);
    TPZFMatrix<double>::~TPZFMatrix(&local_658,&PTR_PTR_0189a4d8);
    if (local_718.fStore != adStack_6f8) {
      local_718.fNAlloc = 0;
      local_718._vptr_TPZVec = local_a90;
      if (local_718.fStore != (double *)0x0) {
        operator_delete__(local_718.fStore);
      }
    }
    if (local_a20 != &uStack_a08) {
      local_a10 = 0;
      local_a28 = &PTR__TPZVec_0189a180;
      if (local_a20 != (undefined6 *)0x0) {
        operator_delete__(local_a20);
      }
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_110,local_a58);
  }
  else {
    TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)&local_658,0);
    bVar2 = MapToNeighSide<double>(local_a98,0x12,3,xi,(TPZVec<double> *)&local_658,&local_208);
    if (!bVar2) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
                 ,0x215);
    }
    TPZGeoElSide::TPZGeoElSide((TPZGeoElSide *)&local_378,local_a98->fNeighbours + 0xd,local_a70);
    TPZGeoElSide::X((TPZGeoElSide *)&local_378,(TPZVec<double> *)&local_658,result);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)&local_658);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_208,&PTR_PTR_01816200);
  TPZManVector<double,_3>::~TPZManVector(&local_850);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}